

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O2

int Fra_SmlNodesAreEqual(Aig_Obj_t *pObj0,Aig_Obj_t *pObj1)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  lVar4 = *(long *)((long)(pObj0->field_5).pData + 0x38);
  iVar3 = *(int *)(lVar4 + 0x14);
  lVar5 = (long)*(int *)(lVar4 + 0x18);
  do {
    if (iVar3 <= lVar5) {
      return 1;
    }
    lVar1 = lVar5 * 4;
    lVar2 = lVar5 * 4;
    lVar5 = lVar5 + 1;
  } while (*(int *)(lVar4 + (long)(pObj0->Id * iVar3) * 4 + 0x28 + lVar1) ==
           *(int *)(lVar4 + (long)(pObj1->Id * iVar3) * 4 + 0x28 + lVar2));
  return 0;
}

Assistant:

int Fra_SmlNodesAreEqual( Aig_Obj_t * pObj0, Aig_Obj_t * pObj1 )
{
    Fra_Man_t * p = (Fra_Man_t *)pObj0->pData;
    unsigned * pSims0, * pSims1;
    int i;
    pSims0 = Fra_ObjSim(p->pSml, pObj0->Id);
    pSims1 = Fra_ObjSim(p->pSml, pObj1->Id);
    for ( i = p->pSml->nWordsPref; i < p->pSml->nWordsTotal; i++ )
        if ( pSims0[i] != pSims1[i] )
            return 0;
    return 1;
}